

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

void __thiscall SimpleString::deallocateInternalBuffer(SimpleString *this)

{
  char *pcVar1;
  size_t sVar2;
  TestMemoryAllocator *pTVar3;
  
  pcVar1 = this->buffer_;
  if (pcVar1 != (char *)0x0) {
    sVar2 = this->bufferSize_;
    pTVar3 = stringAllocator_;
    if (stringAllocator_ == (TestMemoryAllocator *)0x0) {
      pTVar3 = defaultNewArrayAllocator();
    }
    (*pTVar3->_vptr_TestMemoryAllocator[3])
              (pTVar3,pcVar1,sVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O3/CMake/cpputest/cpputest-src/src/CppUTest/SimpleString.cpp"
               ,0xec);
    this->buffer_ = (char *)0x0;
    this->bufferSize_ = 0;
  }
  return;
}

Assistant:

void SimpleString::deallocateInternalBuffer()
{
    if (buffer_) {
        deallocStringBuffer(buffer_, bufferSize_, __FILE__, __LINE__);
        buffer_ = NULLPTR;
        bufferSize_ = 0;
    }
}